

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ValidPadding::MergeFrom(ValidPadding *this,ValidPadding *from)

{
  ulong uVar1;
  LogMessage *other;
  BorderAmounts *pBVar2;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x5427);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (ValidPadding *)_ValidPadding_default_instance_) &&
     (from->paddingamounts_ != (BorderAmounts *)0x0)) {
    if (this->paddingamounts_ == (BorderAmounts *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pBVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BorderAmounts>
                         (arena);
      this->paddingamounts_ = pBVar2;
    }
    from_00 = (undefined1 *)from->paddingamounts_;
    if ((BorderAmounts *)from_00 == (BorderAmounts *)0x0) {
      from_00 = _BorderAmounts_default_instance_;
    }
    BorderAmounts::MergeFrom(this->paddingamounts_,(BorderAmounts *)from_00);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ValidPadding::MergeFrom(const ValidPadding& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ValidPadding)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_paddingamounts()) {
    _internal_mutable_paddingamounts()->::CoreML::Specification::BorderAmounts::MergeFrom(from._internal_paddingamounts());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}